

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::CaseConvertOperator<true>>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  string_t *psVar5;
  string_t *psVar6;
  optional_idx sel_vector;
  idx_t iVar7;
  Vector *pVVar8;
  SelectionVector *sel;
  Vector *vector;
  anon_struct_16_3_d7536bce_for_pointer aVar9;
  string_t input_00;
  optional_idx dict_size;
  string_t *local_70;
  ValidityMask local_68;
  
  VVar1 = input->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar5 = (string_t *)result->data;
    psVar6 = (string_t *)input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::CaseConvertOperator<true>>>
              (psVar6,psVar5,count,&input->validity,&result->validity,dataptr,adds_nulls);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      if ((((errors == CANNOT_ERROR) &&
           (dict_size = DictionaryVector::DictionarySize(input),
           dict_size.index != 0xffffffffffffffff)) &&
          (iVar7 = optional_idx::GetIndex(&dict_size), iVar7 * 2 <= count)) &&
         (pVVar8 = DictionaryVector::Child(input), pVVar8->vector_type == FLAT_VECTOR)) {
        psVar5 = (string_t *)result->data;
        psVar6 = (string_t *)pVVar8->data;
        iVar7 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(pVVar8);
        FlatVector::VerifyFlatVector(result);
        ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::CaseConvertOperator<true>>>
                  (psVar6,psVar5,iVar7,&pVVar8->validity,&result->validity,dataptr,adds_nulls);
        sel = DictionaryVector::SelVector(input);
        iVar7 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar7,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      pVVar8 = (Vector *)dataptr;
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      paVar2 = (anon_union_16_2_67f50693_for_value *)result->data;
      pdVar3 = input->data;
      puVar4 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      input_00.value.pointer.ptr = (char *)dataptr;
      input_00.value._0_8_ = *(undefined8 *)(pdVar3 + 8);
      aVar9 = (anon_struct_16_3_d7536bce_for_pointer)
              CaseConvertOperator<true>::Operation<duckdb::string_t,duckdb::string_t>
                        (*(CaseConvertOperator<true> **)pdVar3,input_00,pVVar8);
      paVar2->pointer = aVar9;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    sel_vector = dict_size;
    psVar5 = (string_t *)result->data;
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::CaseConvertOperator<true>>>
              (local_70,psVar5,count,(SelectionVector *)sel_vector.index,&local_68,&result->validity
               ,dataptr,adds_nulls);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}